

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O2

TokenStringsExt * __thiscall
gl4cts::SparseTexture2LookupTestCase::createLookupShaderTokens
          (TokenStringsExt *__return_storage_ptr__,SparseTexture2LookupTestCase *this,GLint target,
          GLint format,GLint level,GLint sample,FunctionToken *funcToken)

{
  string *psVar1;
  bool bVar2;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string *psVar4;
  string *psVar5;
  string *psVar6;
  string *psVar7;
  string funcName;
  string inputType;
  string samplerSufix;
  TokenStrings ss;
  GLint local_25c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  string *local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  undefined1 *local_190;
  undefined8 local_188;
  undefined1 local_180 [16];
  TokenStrings local_170;
  
  local_25c = level;
  std::__cxx11::string::string((string *)&local_238,(string *)funcToken);
  TokenStringsExt::TokenStringsExt(__return_storage_ptr__);
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  local_210._M_string_length = 0;
  local_210.field_2._M_local_buf[0] = '\0';
  local_190 = local_180;
  local_188 = 0;
  local_180[0] = 0;
  std::operator==(&local_238,"sparseImageLoadARB");
  std::__cxx11::string::assign((char *)&local_210);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"image",(allocator<char> *)&local_258);
  this_00 = &local_210;
  std::__cxx11::string::string((string *)&local_1b0,(string *)this_00);
  SparseTexture2CommitmentTestCase::createShaderTokens
            (&local_170,(SparseTexture2CommitmentTestCase *)this_00,target,format,sample,&local_1d0,
             &local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::_M_assign((string *)&(__return_storage_ptr__->super_TokenStrings).epsilon);
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  psVar7 = &(__return_storage_ptr__->super_TokenStrings).inputType;
  std::__cxx11::string::_M_assign((string *)psVar7);
  std::__cxx11::string::_M_assign
            ((string *)&(__return_storage_ptr__->super_TokenStrings).outputType);
  local_218 = &(__return_storage_ptr__->super_TokenStrings).pointDef;
  std::__cxx11::string::_M_assign((string *)local_218);
  std::__cxx11::string::_M_assign((string *)&(__return_storage_ptr__->super_TokenStrings).pointType)
  ;
  std::__cxx11::string::_M_assign
            ((string *)&(__return_storage_ptr__->super_TokenStrings).resultDefault);
  psVar6 = &(__return_storage_ptr__->super_TokenStrings).resultExpected;
  std::__cxx11::string::_M_assign((string *)psVar6);
  std::__cxx11::string::_M_assign
            ((string *)&(__return_storage_ptr__->super_TokenStrings).returnType);
  std::__cxx11::string::_M_assign((string *)&(__return_storage_ptr__->super_TokenStrings).sampleDef)
  ;
  bVar2 = std::operator==(&local_210,"image");
  if (bVar2) {
    std::operator+(&local_258,", ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__);
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->formatDef,(string *)&local_258);
    std::__cxx11::string::~string((string *)&local_258);
  }
  if (format == 0x81a5) {
    std::__cxx11::string::assign((char *)&__return_storage_ptr__->refZDef);
    bVar2 = std::operator==(&local_210,"sampler");
    if ((((bVar2) && (target != 0x806f)) && (target != 0x9100)) && (target != 0x9102)) {
      std::operator+(&local_258,psVar7,"Shadow");
      std::__cxx11::string::operator=((string *)psVar7,(string *)&local_258);
      std::__cxx11::string::~string((string *)&local_258);
    }
  }
  psVar7 = &__return_storage_ptr__->coordType;
  std::__cxx11::string::assign((char *)psVar7);
  std::__cxx11::string::assign((char *)&__return_storage_ptr__->offsetType);
  std::__cxx11::string::assign((char *)&__return_storage_ptr__->nOffsetType);
  psVar1 = &__return_storage_ptr__->offsetDim;
  std::__cxx11::string::assign((char *)psVar1);
  if (target == 0xde0) {
LAB_00ad85c3:
    std::__cxx11::string::assign((char *)psVar7);
    std::__cxx11::string::assign((char *)&__return_storage_ptr__->offsetType);
    std::__cxx11::string::assign((char *)&__return_storage_ptr__->nOffsetType);
    psVar4 = psVar1;
LAB_00ad8654:
    std::__cxx11::string::assign((char *)psVar4);
  }
  else {
    if (target == 0x806f) {
      std::__cxx11::string::assign((char *)psVar7);
      psVar4 = psVar1;
      goto LAB_00ad8654;
    }
    psVar4 = psVar7;
    if (target == 0x8513) {
LAB_00ad85fc:
      std::__cxx11::string::assign((char *)psVar4);
      std::__cxx11::string::assign((char *)psVar1);
      lVar3 = std::__cxx11::string::find((char *)&local_238,0x16463c8);
      if (lVar3 == -1) {
        psVar4 = &__return_storage_ptr__->cubeMapCoordDef;
        goto LAB_00ad8654;
      }
    }
    else {
      if ((target == 0x9102) || (target == 0x8c1a)) goto LAB_00ad8654;
      if (target == 0x9009) {
        std::__cxx11::string::assign((char *)psVar7);
        psVar4 = &__return_storage_ptr__->coordDef;
        goto LAB_00ad85fc;
      }
      if (target == 0x8c18) goto LAB_00ad85c3;
    }
  }
  psVar5 = (string *)&__return_storage_ptr__->coordDef;
  if ((__return_storage_ptr__->coordDef)._M_string_length == 0) {
    std::__cxx11::string::_M_assign(psVar5);
  }
  lVar3 = std::__cxx11::string::find((char *)&local_238,0x17c5e53);
  if (lVar3 == -1) {
    if (format == 0x81a5) {
      if (target == 0x9009) {
        psVar5 = (string *)&funcToken->arguments;
      }
      else {
        bVar2 = std::operator==(psVar7,"vec2");
        if ((bVar2) || (bVar2 = std::operator==(psVar7,"vec3"), bVar2)) {
          std::__cxx11::string::assign((char *)psVar7);
        }
      }
      std::__cxx11::string::append(psVar5);
      psVar6 = &__return_storage_ptr__->componentDef;
      goto LAB_00ad875f;
    }
  }
  else {
    lVar3 = std::__cxx11::string::find((char *)&local_238,0x18cc2a9);
    if (lVar3 != -1) {
      std::__cxx11::string::assign((char *)&__return_storage_ptr__->offsetArrayDef);
    }
    if (format != 0x81a5) {
      std::__cxx11::string::assign((char *)&__return_storage_ptr__->componentDef);
    }
LAB_00ad875f:
    std::__cxx11::string::assign((char *)psVar6);
  }
  if (target != 0x84f5) {
    if ((target != 0x9100) && (target != 0x9102)) {
      de::toString<int>(&local_258,&local_25c);
      std::__cxx11::string::operator=((string *)&__return_storage_ptr__->lod,(string *)&local_258);
      std::__cxx11::string::~string((string *)&local_258);
      de::toString<int>(&local_1f0,&local_25c);
      std::operator+(&local_258,", ",&local_1f0);
      std::__cxx11::string::operator=
                ((string *)&__return_storage_ptr__->lodDef,(string *)&local_258);
      std::__cxx11::string::~string((string *)&local_258);
      std::__cxx11::string::~string((string *)&local_1f0);
      if (target == 0x84f5) goto LAB_00ad8862;
    }
    lVar3 = std::__cxx11::string::find((char *)&local_238,0x16463c8);
    if (lVar3 == -1) {
      std::__cxx11::string::find((char *)&local_238,0x16ff18d);
    }
  }
LAB_00ad8862:
  std::__cxx11::string::assign((char *)&__return_storage_ptr__->pointCoord);
  if ((format == 0x81a5) &&
     (lVar3 = std::__cxx11::string::find((char *)&local_238,0x17c5e53), lVar3 == -1)) {
    bVar2 = std::operator==(psVar7,"vec3");
    if (((target != 0x8c18) || (!bVar2)) && (bVar2 = std::operator==(psVar7,"vec3"), !bVar2)) {
      bVar2 = std::operator==(psVar7,"vec4");
joined_r0x00ad8976:
      if (!bVar2) goto LAB_00ad89a7;
    }
  }
  else {
    bVar2 = std::operator==(psVar7,"float");
    if ((!bVar2) &&
       ((((bVar2 = std::operator==(psVar7,"vec2"), target != 0x8c18 || (!bVar2)) &&
         (bVar2 = std::operator==(psVar7,"vec2"), !bVar2)) &&
        (bVar2 = std::operator==(psVar7,"vec3"), !bVar2)))) {
      bVar2 = std::operator==(psVar7,"vec4");
      goto joined_r0x00ad8976;
    }
  }
  std::__cxx11::string::assign((char *)&__return_storage_ptr__->sizeDef);
LAB_00ad89a7:
  bVar2 = std::operator!=(psVar7,"float");
  if (bVar2) {
    std::operator+(&local_258,"i",psVar7);
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->iCoordType,(string *)&local_258);
    std::__cxx11::string::~string((string *)&local_258);
  }
  else {
    std::__cxx11::string::assign((char *)&__return_storage_ptr__->iCoordType);
  }
  SparseTexture2CommitmentTestCase::TokenStrings::~TokenStrings(&local_170);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_238);
  return __return_storage_ptr__;
}

Assistant:

SparseTexture2LookupTestCase::TokenStringsExt SparseTexture2LookupTestCase::createLookupShaderTokens(
	GLint target, GLint format, GLint level, GLint sample, FunctionToken& funcToken)
{
	std::string funcName = funcToken.name;

	TokenStringsExt s;

	std::string inputType;
	std::string samplerSufix;

	if (funcName == "sparseImageLoadARB")
		inputType = "image";
	else
		inputType = "sampler";

	// Copy data from TokenStrings to TokenStringsExt
	TokenStrings ss  = createShaderTokens(target, format, sample, "image", inputType);
	s.epsilon		 = ss.epsilon;
	s.format		 = ss.format;
	s.inputType		 = ss.inputType;
	s.outputType	 = ss.outputType;
	s.pointDef		 = ss.pointDef;
	s.pointType		 = ss.pointType;
	s.resultDefault  = ss.resultDefault;
	s.resultExpected = ss.resultExpected;
	s.returnType	 = ss.returnType;
	s.sampleDef		 = ss.sampleDef;

	// Set format definition for image input types
	if (inputType == "image")
		s.formatDef = ", " + s.format;

	// Set tokens for depth texture format
	if (format == GL_DEPTH_COMPONENT16)
	{
		s.refZDef = ", 0.5";

		if (inputType == "sampler" && target != GL_TEXTURE_3D && target != GL_TEXTURE_2D_MULTISAMPLE &&
			target != GL_TEXTURE_2D_MULTISAMPLE_ARRAY)
		{
			s.inputType = s.inputType + "Shadow";
		}
	}

	// Set coord type, coord definition and offset vector dimensions
	s.coordType   = "vec2";
	s.offsetType  = "ivec";
	s.nOffsetType = "vec";
	s.offsetDim   = "2";
	if (target == GL_TEXTURE_1D)
	{
		s.coordType   = "float";
		s.offsetType  = "int";
		s.nOffsetType = "float";
		s.offsetDim   = "";
	}
	else if (target == GL_TEXTURE_1D_ARRAY)
	{
		s.coordType   = "vec2";
		s.offsetType  = "int";
		s.nOffsetType = "float";
		s.offsetDim   = "";
	}
	else if (target == GL_TEXTURE_2D_ARRAY)
	{
		s.coordType = "vec3";
	}
	else if (target == GL_TEXTURE_3D)
	{
		s.coordType = "vec3";
		s.offsetDim = "3";
	}
	else if (target == GL_TEXTURE_CUBE_MAP)
	{
		s.coordType = "vec3";
		s.offsetDim = "3";
	}
	else if (target == GL_TEXTURE_CUBE_MAP_ARRAY)
	{
		s.coordType = "vec4";
		s.coordDef  = "gl_WorkGroupID.x, gl_WorkGroupID.y, gl_WorkGroupID.z % 6, floor(gl_WorkGroupID.z / 6)";
		s.offsetDim = "3";
	}
	else if (target == GL_TEXTURE_2D_MULTISAMPLE_ARRAY)
	{
		s.coordType = "vec3";
	}

	if ((target == GL_TEXTURE_CUBE_MAP || target == GL_TEXTURE_CUBE_MAP_ARRAY) &&
		funcName.find("Fetch", 0) == std::string::npos)
	{
		s.cubeMapCoordDef = "    if (point.z == 0) coord.xyz = vec3(1, coord.y * 2 - 1, -coord.x * 2 + 1);\n"
							"    if (point.z == 1) coord.xyz = vec3(-1, coord.y * 2 - 1, coord.x * 2 - 1);\n"
							"    if (point.z == 2) coord.xyz = vec3(coord.x * 2 - 1, 1, coord.y * 2 - 1);\n"
							"    if (point.z == 3) coord.xyz = vec3(coord.x * 2 - 1, -1, -coord.y * 2 + 1);\n"
							"    if (point.z == 4) coord.xyz = vec3(coord.x * 2 - 1, coord.y * 2 - 1, 1);\n"
							"    if (point.z == 5) coord.xyz = vec3(-coord.x * 2 + 1, coord.y * 2 - 1, -1);\n";
	}

	if (s.coordDef.empty())
		s.coordDef = s.pointDef;

	// Set expected result vector, component definition and offset array definition for gather functions
	if (funcName.find("Gather", 0) != std::string::npos)
	{
		if (funcName.find("GatherOffsets", 0) != std::string::npos)
		{
			s.offsetArrayDef = "    <OFFSET_TYPE><OFFSET_DIM> offsetsArray[4];\n"
							   "    offsetsArray[0] = <OFFSET_TYPE><OFFSET_DIM>(0);\n"
							   "    offsetsArray[1] = <OFFSET_TYPE><OFFSET_DIM>(0);\n"
							   "    offsetsArray[2] = <OFFSET_TYPE><OFFSET_DIM>(0);\n"
							   "    offsetsArray[3] = <OFFSET_TYPE><OFFSET_DIM>(0);\n";
		}

		if (format != GL_DEPTH_COMPONENT16)
			s.componentDef = ", 0";
		s.resultExpected   = "(1, 1, 1, 1)";
	}
	// Extend coord type dimension and coord vector definition if shadow sampler and non-cube map array target selected
	// Set component definition to red component
	else if (format == GL_DEPTH_COMPONENT16)
	{
		if (target != GL_TEXTURE_CUBE_MAP_ARRAY)
		{
			if (s.coordType == "vec2")
				s.coordType = "vec3";
			else if (s.coordType == "vec3")
				s.coordType = "vec4";
			s.coordDef += s.refZDef;
		}
		else
			funcToken.arguments += s.refZDef;

		s.componentDef = ".r";
	}

	// Set level of details definition
	if (target != GL_TEXTURE_RECTANGLE && target != GL_TEXTURE_2D_MULTISAMPLE &&
		target != GL_TEXTURE_2D_MULTISAMPLE_ARRAY)
	{
		s.lod	= de::toString(level);
		s.lodDef = ", " + de::toString(level);
	}

	// Set proper coord vector
	if (target == GL_TEXTURE_RECTANGLE || funcName.find("Fetch") != std::string::npos ||
		funcName.find("ImageLoad") != std::string::npos)
	{
		s.pointCoord = "icoord";
	}
	else
		s.pointCoord = "coord";

	// Set size vector definition
	if (format != GL_DEPTH_COMPONENT16 || funcName.find("Gather", 0) != std::string::npos)
	{
		if (s.coordType == "float")
			s.sizeDef = "<TEX_WIDTH>";
		else if (s.coordType == "vec2" && target == GL_TEXTURE_1D_ARRAY)
			s.sizeDef = "<TEX_WIDTH>, <TEX_DEPTH>";
		else if (s.coordType == "vec2")
			s.sizeDef = "<TEX_WIDTH>, <TEX_HEIGHT>";
		else if (s.coordType == "vec3")
			s.sizeDef = "<TEX_WIDTH>, <TEX_HEIGHT>, <TEX_DEPTH>";
		else if (s.coordType == "vec4")
			s.sizeDef = "<TEX_WIDTH>, <TEX_HEIGHT>, floor(<TEX_DEPTH> / 6), 6";
	}
	// Set size vector for shadow samplers and non-gether functions selected
	else
	{
		if (s.coordType == "vec3" && target == GL_TEXTURE_1D_ARRAY)
			s.sizeDef = "<TEX_WIDTH>, <TEX_DEPTH>, 1";
		else if (s.coordType == "vec3")
			s.sizeDef = "<TEX_WIDTH>, <TEX_HEIGHT>, 1";
		else if (s.coordType == "vec4")
			s.sizeDef = "<TEX_WIDTH>, <TEX_HEIGHT>, <TEX_DEPTH>, 1";
	}

	if (s.coordType != "float")
		s.iCoordType = "i" + s.coordType;
	else
		s.iCoordType = "int";

	return s;
}